

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O1

int __thiscall
icu_63::EthiopicCalendar::clone
          (EthiopicCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CECalendar *this_00;
  
  this_00 = (CECalendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 == (CECalendar *)0x0) {
    this_00 = (CECalendar *)0x0;
  }
  else {
    CECalendar::CECalendar(this_00,&this->super_CECalendar);
    (this_00->super_Calendar).super_UObject._vptr_UObject =
         (_func_int **)&PTR__EthiopicCalendar_003d3708;
    *(undefined4 *)&(this_00->super_Calendar).field_0x264 =
         *(undefined4 *)&(this->super_CECalendar).super_Calendar.field_0x264;
  }
  return (int)this_00;
}

Assistant:

Calendar*
EthiopicCalendar::clone() const
{
    return new EthiopicCalendar(*this);
}